

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O1

int check_default(lys_type *type,char **value,lys_module *module,int tpdf)

{
  LY_DATA_TYPE LVar1;
  lys_node_leaf *plVar2;
  lys_tpdf *plVar3;
  undefined8 uVar4;
  lys_ext_instance **pplVar5;
  lys_module *plVar6;
  lys_restr *plVar7;
  lys_node *plVar8;
  int iVar9;
  lys_node *plVar10;
  char *pcVar11;
  LY_ERR *pLVar12;
  lys_type *plVar13;
  lyd_node *plVar14;
  lys_tpdf *plVar15;
  undefined1 auStack_88 [8];
  lyd_node_leaf_list node;
  lyd_node *local_38;
  char *dflt;
  
  local_38 = (lyd_node *)0x0;
  if (value == (char **)0x0) {
    __assert_fail("value",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                  ,0xbdf,
                  "int check_default(struct lys_type *, const char **, struct lys_module *, int)");
  }
  LVar1 = type->base;
  if (LVar1 < LY_TYPE_BINARY) {
    return 1;
  }
  iVar9 = 0;
  if (tpdf != 0 && LVar1 == LY_TYPE_LEAFREF) {
    return 0;
  }
  local_38 = (lyd_node *)*value;
  if (local_38 != (lyd_node *)0x0) {
    if (LVar1 == LY_TYPE_EMPTY) {
      ly_vlog(LYE_INCHILDSTMT,LY_VLOG_NONE,(void *)0x0,"default",type->parent->name);
      ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
              "The \"empty\" data type cannot have a default value.");
      return -1;
    }
    plVar15 = (lys_tpdf *)0x0;
    goto switchD_0011d2f4_caseD_b;
  }
  plVar3 = type->der;
  do {
    plVar15 = plVar3;
    plVar3 = (plVar15->type).der;
    plVar14 = local_38;
    if (plVar3 == (lys_tpdf *)0x0) break;
    plVar14 = (lyd_node *)plVar15->dflt;
  } while ((lyd_node *)plVar15->dflt == (lyd_node *)0x0);
  local_38 = plVar14;
  if (local_38 == (lyd_node *)0x0) {
    return 0;
  }
  switch(LVar1) {
  case LY_TYPE_BINARY:
  case LY_TYPE_DEC64:
  case LY_TYPE_INT8:
  case LY_TYPE_UINT8:
  case LY_TYPE_INT16:
  case LY_TYPE_UINT16:
  case LY_TYPE_INT32:
  case LY_TYPE_UINT32:
  case LY_TYPE_INT64:
  case LY_TYPE_UINT64:
    plVar2 = (lys_node_leaf *)(type->info).bits.bit;
joined_r0x0011d533:
    if (plVar2 == (lys_node_leaf *)0x0) {
      return 0;
    }
    break;
  case LY_TYPE_BITS:
  case LY_TYPE_ENUM:
    if ((type->info).bits.count == 0) {
      return 0;
    }
    break;
  case LY_TYPE_BOOL:
  case LY_TYPE_EMPTY:
  case LY_TYPE_IDENT:
  case LY_TYPE_INST:
  case LY_TYPE_LEAFREF:
    goto switchD_0011d2f4_caseD_3;
  case LY_TYPE_STRING:
    if ((type->info).bits.bit == (lys_type_bit *)0x0) {
      plVar2 = (type->info).lref.target;
      goto joined_r0x0011d533;
    }
    break;
  case LY_TYPE_UNION:
    break;
  default:
    pLVar12 = ly_errno_location();
    *pLVar12 = LY_EINT;
    ly_log(LY_LLERR,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c",
           0xc2c);
    goto LAB_0011d42f;
  }
switchD_0011d2f4_caseD_b:
  node.value_str = (char *)0x0;
  node.next = (lyd_node *)0x0;
  node.prev = (lyd_node *)0x0;
  node.validity = '\0';
  node._9_7_ = 0;
  node.attr = (lyd_attr *)0x0;
  auStack_88 = (undefined1  [8])0x0;
  node.schema = (lys_node *)0x0;
  node.parent = local_38;
  node.value.dec64._2_6_ = 0;
  node.value.int16 = (ushort)LVar1;
  node._64_8_ = module;
  plVar10 = (lys_node *)calloc(1,200);
  auStack_88 = (undefined1  [8])plVar10;
  if (plVar10 == (lys_node *)0x0) {
    pLVar12 = ly_errno_location();
    *pLVar12 = LY_EMEM;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","check_default");
  }
  else {
    pcVar11 = strdup("fake-default");
    plVar10->name = pcVar11;
    if (pcVar11 != (char *)0x0) {
      plVar10->module = (lys_module *)node._64_8_;
      uVar4._0_4_ = type->base;
      uVar4._4_1_ = type->ext_size;
      uVar4._5_3_ = *(undefined3 *)&type->field_0xd;
      pplVar5 = type->ext;
      plVar3 = type->der;
      plVar6 = (lys_module *)type->parent;
      plVar7 = (type->info).binary.length;
      plVar2 = (type->info).lref.target;
      plVar8 = (lys_node *)(type->info).dec64.div;
      plVar10[1].ref = type->module_name;
      plVar10[1].flags = (short)(undefined4)uVar4;
      plVar10[1].ext_size = (char)((ulong)uVar4 >> 0x10);
      plVar10[1].iffeature_size = (char)((ulong)uVar4 >> 0x18);
      plVar10[1].padding[0] = (char)((ulong)uVar4 >> 0x20);
      plVar10[1].padding[1] = (char)((ulong)uVar4 >> 0x28);
      plVar10[1].padding[2] = (char)((ulong)uVar4 >> 0x30);
      plVar10[1].padding[3] = (char)((ulong)uVar4 >> 0x38);
      plVar10[1].ext = pplVar5;
      plVar10[1].iffeature = (lys_iffeature *)plVar3;
      plVar10[1].module = plVar6;
      *(lys_restr **)&plVar10[1].nodetype = plVar7;
      plVar10[1].parent = (lys_node *)plVar2;
      plVar10[1].child = plVar8;
      if (LVar1 == LY_TYPE_LEAFREF) {
        plVar2 = (type->info).lref.target;
        if (plVar2 == (lys_node_leaf *)0x0) {
LAB_0011d4e3:
          iVar9 = 1;
          goto LAB_0011d4e9;
        }
        iVar9 = check_default(&plVar2->type,(char **)&local_38,(lys_module *)node._64_8_,0);
        if (iVar9 != 0) goto LAB_0011d4e9;
        plVar14 = local_38;
        if (*value != (char *)0x0) goto LAB_0011d47b;
      }
      else {
        plVar13 = lyp_parse_value((lys_type *)&plVar10[1].ref,(char **)&node.parent,
                                  (lyxml_elem *)0x0,(lyd_node_leaf_list *)auStack_88,(lyd_attr *)0x0
                                  ,1,1);
        if (plVar13 == (lys_type *)0x0) {
          if (plVar15 != (lys_tpdf *)0x0) {
            iVar9 = 1;
            if (type->base == LY_TYPE_ENUM) {
              plVar3 = (type->der->type).der;
            }
            else {
              if (type->base != LY_TYPE_BITS) goto LAB_0011d4e9;
              plVar3 = (type->der->type).der;
            }
            if (plVar3 != (lys_tpdf *)0x0) {
              ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
                      "Invalid value \"%s\" of the default statement inherited to \"%s\" from \"%s\" base type."
                      ,local_38,type->parent->name,plVar15->name);
            }
            goto LAB_0011d4e9;
          }
          goto LAB_0011d4e3;
        }
        if (local_38 != node.parent) {
          plVar14 = node.parent;
          if (local_38 != (lyd_node *)*value) {
            __assert_fail("dflt == *value",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                          ,0xc66,
                          "int check_default(struct lys_type *, const char **, struct lys_module *, int)"
                         );
          }
LAB_0011d47b:
          *value = (char *)plVar14;
        }
      }
      iVar9 = 0;
LAB_0011d4e9:
      if (node.value.int16 == 2) {
        free(node.value_str);
      }
      free(*(char **)auStack_88);
      free((void *)auStack_88);
      return iVar9;
    }
    pLVar12 = ly_errno_location();
    *pLVar12 = LY_EMEM;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","check_default");
    free((void *)auStack_88);
  }
LAB_0011d42f:
  iVar9 = -1;
switchD_0011d2f4_caseD_3:
  return iVar9;
}

Assistant:

static int
check_default(struct lys_type *type, const char **value, struct lys_module *module, int tpdf)
{
    struct lys_tpdf *base_tpdf = NULL;
    struct lyd_node_leaf_list node;
    const char *dflt = NULL;
    int ret = EXIT_SUCCESS;

    assert(value);

    if (type->base <= LY_TYPE_DER) {
        /* the type was not resolved yet, nothing to do for now */
        return EXIT_FAILURE;
    } else if (type->base == LY_TYPE_LEAFREF && tpdf) {
        /* leafref in typedef cannot be checked */
        return EXIT_SUCCESS;
    }

    dflt = *value;
    if (!dflt) {
        /* we do not have a new default value, so is there any to check even, in some base type? */
        for (base_tpdf = type->der; base_tpdf->type.der; base_tpdf = base_tpdf->type.der) {
            if (base_tpdf->dflt) {
                dflt = base_tpdf->dflt;
                break;
            }
        }

        if (!dflt) {
            /* no default value, nothing to check, all is well */
            return EXIT_SUCCESS;
        }

        /* so there is a default value in a base type, but can the default value be no longer valid (did we define some new restrictions)? */
        switch (type->base) {
        case LY_TYPE_IDENT:
        case LY_TYPE_INST:
        case LY_TYPE_LEAFREF:
        case LY_TYPE_BOOL:
        case LY_TYPE_EMPTY:
            /* these have no restrictions, so we would do the exact same work as the unres in the base typedef */
            return EXIT_SUCCESS;
        case LY_TYPE_BITS:
            /* the default value must match the restricted list of values, if the type was restricted */
            if (type->info.bits.count) {
                break;
            }
            return EXIT_SUCCESS;
        case LY_TYPE_ENUM:
            /* the default value must match the restricted list of values, if the type was restricted */
            if (type->info.enums.count) {
                break;
            }
            return EXIT_SUCCESS;
        case LY_TYPE_DEC64:
            if (type->info.dec64.range) {
                break;
            }
            return EXIT_SUCCESS;
        case LY_TYPE_BINARY:
            if (type->info.binary.length) {
                break;
            }
            return EXIT_SUCCESS;
        case LY_TYPE_INT8:
        case LY_TYPE_INT16:
        case LY_TYPE_INT32:
        case LY_TYPE_INT64:
        case LY_TYPE_UINT8:
        case LY_TYPE_UINT16:
        case LY_TYPE_UINT32:
        case LY_TYPE_UINT64:
            if (type->info.num.range) {
                break;
            }
            return EXIT_SUCCESS;
        case LY_TYPE_STRING:
            if (type->info.str.length || type->info.str.patterns) {
                break;
            }
            return EXIT_SUCCESS;
        case LY_TYPE_UNION:
            /* way too much trouble learning whether we need to check the default again, so just do it */
            break;
        default:
            LOGINT;
            return -1;
        }
    } else if (type->base == LY_TYPE_EMPTY) {
        LOGVAL(LYE_INCHILDSTMT, LY_VLOG_NONE, NULL, "default", type->parent->name);
        LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "The \"empty\" data type cannot have a default value.");
        return -1;
    }

    /* dummy leaf */
    memset(&node, 0, sizeof node);
    node.value_str = dflt;
    node.value_type = type->base;
    node.schema = calloc(1, sizeof (struct lys_node_leaf));
    if (!node.schema) {
        LOGMEM;
        return -1;
    }
    node.schema->name = strdup("fake-default");
    if (!node.schema->name) {
        LOGMEM;
        free(node.schema);
        return -1;
    }
    node.schema->module = module;
    memcpy(&((struct lys_node_leaf *)node.schema)->type, type, sizeof *type);

    if (type->base == LY_TYPE_LEAFREF) {
        if (!type->info.lref.target) {
            ret = EXIT_FAILURE;
            goto finish;
        }
        ret = check_default(&type->info.lref.target->type, &dflt, module, 0);
        if (!ret) {
            /* adopt possibly changed default value to its canonical form */
            if (*value) {
                *value = dflt;
            }
        }
    } else {
        if (!lyp_parse_value(&((struct lys_node_leaf *)node.schema)->type, &node.value_str, NULL, &node, NULL, 1, 1)) {
            /* possible forward reference */
            ret = 1;
            if (base_tpdf) {
                /* default value is defined in some base typedef */
                if ((type->base == LY_TYPE_BITS && type->der->type.der) ||
                        (type->base == LY_TYPE_ENUM && type->der->type.der)) {
                    /* we have refined bits/enums */
                    LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL,
                           "Invalid value \"%s\" of the default statement inherited to \"%s\" from \"%s\" base type.",
                           dflt, type->parent->name, base_tpdf->name);
                }
            }
        } else {
            /* success - adopt canonical form from the node into the default value */
            if (dflt != node.value_str) {
                /* this can happen only if we have non-inherited default value,
                 * inherited default values are already in canonical form */
                assert(dflt == *value);
                *value = node.value_str;
            }
        }
    }

finish:
    if (node.value_type == LY_TYPE_BITS) {
        free(node.value.bit);
    }
    free((char *)node.schema->name);
    free(node.schema);

    return ret;
}